

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::PackSnorm2x16Case::iterate(PackSnorm2x16Case *this)

{
  Precision PVar1;
  ShaderExecutor *pSVar2;
  int iVar3;
  PackSnorm2x16Case *pPVar4;
  deUint32 dVar5;
  int iVar6;
  char *description;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  float local_238 [2];
  long lStack_230;
  long local_228;
  pointer local_218;
  Hex<8UL> local_210;
  PackSnorm2x16Case *local_208;
  int local_1fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  ulong local_1d8;
  long local_1d0;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  dVar5 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar5 ^ 0x776002);
  local_228 = 0;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  lStack_230 = 0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar1 = this->m_precision;
  if (PVar1 == PRECISION_MEDIUMP) {
    iVar12 = 0x21;
  }
  else {
    iVar12 = 1;
    if ((PVar1 != PRECISION_HIGHP) && (iVar12 = 0x81, PVar1 != PRECISION_LOWP)) {
      iVar12 = 0;
    }
  }
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.0;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = -0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = -0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  iVar7 = 0xf;
  do {
    fVar14 = deRandom_getFloat(&local_1c0);
    local_218 = (pointer)CONCAT44(local_218._4_4_,fVar14);
    fVar14 = deRandom_getFloat(&local_1c0);
    local_1b0._4_4_ = fVar14 * 2.5 + -1.25;
    local_1b0._0_4_ = local_218._0_4_ * 2.5 + -1.25;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
               (Vector<float,_2> *)local_1b0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 0x50;
  do {
    fVar14 = deRandom_getFloat(&local_1c0);
    local_218 = (pointer)CONCAT44(local_218._4_4_,fVar14);
    fVar14 = deRandom_getFloat(&local_1c0);
    local_1b0._4_4_ = fVar14 * 1e+06 + -500000.0;
    local_1b0._0_4_ = local_218._0_4_ * 1e+06 + -500000.0;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
               (Vector<float,_2> *)local_1b0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1f8,lStack_230 - (long)local_238 >> 3);
  local_1b0 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_4_ = local_238[0];
  local_1b0._4_4_ = local_238[1];
  local_210.value =
       (deUint64)
       local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar2->_vptr_ShaderExecutor[6])
            (pSVar2,(ulong)(lStack_230 - (long)local_238) >> 3,local_1b0,&local_210);
  local_1c8 = (ulong)(lStack_230 - (long)local_238) >> 3;
  local_208 = this;
  if ((int)(uint)local_1c8 < 1) {
    iVar7 = 0;
  }
  else {
    uVar9 = (ulong)((uint)local_1c8 & 0x7fffffff);
    lVar10 = 0;
    uVar11 = 0;
    iVar7 = 0;
    local_1d8 = uVar9;
    do {
      fVar14 = *(float *)((long)local_238 + lVar10);
      fVar15 = *(float *)((long)local_238 + 4 + lVar10);
      fVar16 = 1.0;
      if (fVar14 <= 1.0) {
        fVar16 = fVar14;
      }
      fVar16 = (float)(-(uint)(fVar14 < -1.0) & 0xc6fffe00 |
                      ~-(uint)(fVar14 < -1.0) & (uint)(fVar16 * 32767.0));
      uVar13 = -(uint)(fVar16 < 0.0);
      fVar16 = (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000) + fVar16;
      fVar14 = -32768.0;
      if (-32768.0 <= fVar16) {
        fVar14 = fVar16;
      }
      fVar16 = 32767.0;
      if (fVar14 <= 32767.0) {
        fVar16 = fVar14;
      }
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      fVar15 = (float)(-(uint)(fVar15 < -1.0) & 0xc6fffe00 |
                      ~-(uint)(fVar15 < -1.0) & (uint)(fVar14 * 32767.0));
      uVar13 = -(uint)(fVar15 < 0.0);
      fVar15 = (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000) + fVar15;
      fVar14 = -32768.0;
      if (-32768.0 <= fVar15) {
        fVar14 = fVar15;
      }
      fVar15 = 32767.0;
      if (fVar14 <= 32767.0) {
        fVar15 = fVar14;
      }
      uVar13 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      local_218 = (pointer)(ulong)uVar13;
      iVar8 = ((int)fVar16 & 0xffffU) - (uVar13 & 0xffff);
      iVar3 = -iVar8;
      if (0 < iVar8) {
        iVar3 = iVar8;
      }
      iVar6 = ((int)fVar15 & 0xffffU) - (uVar13 >> 0x10);
      iVar8 = -iVar6;
      if (0 < iVar6) {
        iVar8 = iVar6;
      }
      if ((iVar12 < iVar3) || (iVar12 < iVar8)) {
        if (iVar7 < 10) {
          local_1b0 = (undefined1  [8])
                      ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          local_1fc = iVar7;
          local_1d0 = lVar10;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(local_1a8,(int)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,", expected packSnorm2x16(",0x19);
          tcu::operator<<((ostream *)local_1a8,(Vector<float,_2> *)((long)local_238 + local_1d0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") = ",4);
          local_210.value = (deUint64)((int)fVar15 << 0x10 | (int)fVar16 & 0xffffU);
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", got ",6);
          local_210.value = (deUint64)local_218;
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\n  diffs = (",0xc);
          std::ostream::operator<<(local_1a8,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::operator<<(local_1a8,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"), max diff = ",0xe);
          std::ostream::operator<<(local_1a8,iVar12);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar9 = local_1d8;
          lVar10 = local_1d0;
          iVar7 = local_1fc;
        }
        else if (iVar7 == 10) {
          local_1b0 = (undefined1  [8])
                      ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar9 = local_1d8;
        }
        iVar7 = iVar7 + 1;
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar9 != uVar11);
  }
  pPVar4 = local_208;
  local_1b0 = (undefined1  [8])
              ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar12 = (int)local_1c8;
  std::ostream::operator<<(local_1a8,iVar12 - iVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  std::ostream::operator<<(local_1a8,iVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  if (iVar7 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pPVar4->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar7 != 0),description);
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238 != (float  [2])0x0) {
    operator_delete((void *)local_238,local_228 - (long)local_238);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}